

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_4;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_6;
  NetDeclarationSyntax *pNVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_50;
  Token local_48;
  SyntaxNode *local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_50 = (SyntaxNode *)0x0;
  }
  else {
    local_50 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x78),&visitor_1,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_38 = (SyntaxNode *)0x0;
  }
  else {
    local_38 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),&visitor_1,(BumpAllocator *)__child_stack);
  }
  args_6 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x88),
                      (BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xc0),(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NetStrengthSyntax*,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,(NetStrengthSyntax **)&local_50,
                      (Token *)&visitor,(DataTypeSyntax *)args_4,(TimingControlSyntax **)&local_38,
                      args_6,(Token *)&visitor_1);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.netType.deepClone(alloc),
        node.strength ? deepClone(*node.strength, alloc) : nullptr,
        node.expansionHint.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}